

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

void reset_whitespace_and_separators(BidiContext *ctx)

{
  uchar uVar1;
  BidiType t_00;
  bool bVar2;
  _Bool _Var3;
  size_t sVar4;
  ulong uStack_30;
  BidiType t_1;
  size_t i_1;
  size_t sStack_20;
  BidiType t;
  size_t i;
  _Bool modifying;
  BidiContext *ctx_local;
  
  bVar2 = true;
  sStack_20 = ctx->textlen;
  while (sVar4 = sStack_20 - 1, sStack_20 != 0) {
    t_00 = ctx->origTypes[sVar4];
    _Var3 = typeIsSegmentOrParaSeparator(t_00);
    sStack_20 = sVar4;
    if (_Var3) {
      ctx->levels[sVar4] = ctx->paragraphLevel;
      bVar2 = true;
    }
    else if (bVar2) {
      _Var3 = typeIsWhitespaceOrIsolate(t_00);
      if (_Var3) {
        ctx->levels[sVar4] = ctx->paragraphLevel;
      }
      else {
        _Var3 = typeIsRemovedDuringProcessing(t_00);
        if (!_Var3) {
          bVar2 = false;
        }
      }
    }
  }
  for (uStack_30 = 0; uStack_30 < ctx->textlen; uStack_30 = uStack_30 + 1) {
    _Var3 = typeIsRemovedDuringProcessing(ctx->origTypes[uStack_30]);
    if (_Var3) {
      if (uStack_30 == 0) {
        uVar1 = ctx->paragraphLevel;
      }
      else {
        uVar1 = ctx->levels[uStack_30 - 1];
      }
      ctx->levels[uStack_30] = uVar1;
    }
  }
  return;
}

Assistant:

static void reset_whitespace_and_separators(BidiContext *ctx)
{
    /*
     * Rule L1: segment and paragraph separators, plus whitespace
     * preceding them, all reset to the paragraph embedding level.
     * This also applies to whitespace at the very end.
     *
     * This is done using the original types, not the versions that
     * the rest of this algorithm has been merrily mutating.
     */
    bool modifying = true;
    for (size_t i = ctx->textlen; i-- > 0 ;) {
        BidiType t = ctx->origTypes[i];
        if (typeIsSegmentOrParaSeparator(t)) {
            ctx->levels[i] = ctx->paragraphLevel;
            modifying = true;
        } else if (modifying) {
            if (typeIsWhitespaceOrIsolate(t)) {
                ctx->levels[i] = ctx->paragraphLevel;
            } else if (!typeIsRemovedDuringProcessing(t)) {
                modifying = false;
            }
        }
    }

#ifndef REMOVE_FORMATTING_CHARS
    /*
     * Section 5.2 adjustment: types removed by rule X9 take the level
     * of the character to their left.
     */
    for (size_t i = 0; i < ctx->textlen; i++) {
        BidiType t = ctx->origTypes[i];
        if (typeIsRemovedDuringProcessing(t)) {
            /* Section 5.2 adjustment */
            ctx->levels[i] = (i > 0 ? ctx->levels[i-1] : ctx->paragraphLevel);
        }
    }
#endif /* ! REMOVE_FORMATTING_CHARS */
}